

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleDirectoryMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmGlobalGenerator *this_00;
  cmMakefile *this_01;
  char *value;
  PolicyID id;
  allocator local_59;
  string dir;
  string local_38;
  
  if ((this->Name)._M_string_length == 0) {
    this_01 = (this->super_cmCommand).Makefile;
  }
  else {
    std::__cxx11::string::string((string *)&dir,(string *)&this->Name);
    bVar1 = cmsys::SystemTools::FileIsFullPath(dir._M_dataplus._M_p);
    if (!bVar1) {
      cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)&dir);
      std::__cxx11::string::append((char *)&dir);
      std::__cxx11::string::append((string *)&dir);
    }
    cmsys::SystemTools::CollapseFullPath(&local_38,&dir);
    std::__cxx11::string::operator=((string *)&dir,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    this_01 = cmGlobalGenerator::FindMakefile(this_00,&dir);
    if (this_01 == (cmMakefile *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_38,
                 "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,&local_59);
      cmCommand::SetError(&this->super_cmCommand,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&dir);
      return false;
    }
    std::__cxx11::string::~string((string *)&dir);
  }
  bVar1 = std::operator==(&this->PropertyName,"DEFINITIONS");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(this_01,CMP0059);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_003bc52f;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&dir,(cmPolicies *)0x3b,id);
      cmMakefile::IssueMessage(this_01,AUTHOR_WARNING,&dir,false);
      std::__cxx11::string::~string((string *)&dir);
    }
    value = cmMakefile::GetDefineFlagsCMP0059(this_01);
  }
  else {
LAB_003bc52f:
    value = cmMakefile::GetProperty(this_01,&this->PropertyName);
  }
  StoreResult(this,value);
  return true;
}

Assistant:

bool cmGetPropertyCommand::HandleDirectoryMode()
{
  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if(!this->Name.empty())
    {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = this->Name;
    if(!cmSystemTools::FileIsFullPath(dir.c_str()))
      {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += this->Name;
      }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    // Lookup the generator.
    mf = this->Makefile->GetGlobalGenerator()->FindMakefile(dir);
    if (!mf)
      {
      // Could not find the directory.
      this->SetError
        ("DIRECTORY scope provided but requested directory was not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    }

  if (this->PropertyName == "DEFINITIONS")
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0059))
      {
      case cmPolicies::WARN:
        mf->IssueMessage(cmake::AUTHOR_WARNING,
                         cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
      case cmPolicies::OLD:
        return this->StoreResult(mf->GetDefineFlagsCMP0059());
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
      }
    }

  // Get the property.
  return this->StoreResult(mf->GetProperty(this->PropertyName));
}